

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.h
# Opt level: O3

float haarY_improved(integral_image *iimage,int row,int col,int s)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *data;
  int iVar8;
  int iVar9;
  int _b;
  int iVar10;
  int data_width;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  iVar1 = iimage->height;
  iVar12 = iimage->width;
  pfVar3 = iimage->data;
  iVar2 = iimage->data_width;
  fVar13 = 0.0;
  fVar14 = 0.0;
  iVar9 = s / 2;
  iVar8 = col - iVar9;
  iVar4 = row;
  if (iVar1 < row) {
    iVar4 = iVar1;
  }
  iVar5 = iVar8;
  if (iVar12 < iVar8) {
    iVar5 = iVar12;
  }
  iVar10 = iVar4 + -1;
  iVar6 = iVar9 + row;
  if (iVar1 <= iVar9 + row) {
    iVar6 = iVar1;
  }
  iVar11 = iVar5 + -1;
  iVar7 = iVar8 + s;
  if (iVar12 <= iVar8 + s) {
    iVar7 = iVar12;
  }
  if (0 < iVar5 && 0 < iVar4) {
    fVar14 = pfVar3[iVar10 * iVar2 + iVar11];
  }
  iVar12 = iVar7 + -1;
  if (0 < iVar7 && 0 < iVar4) {
    fVar13 = pfVar3[iVar10 * iVar2 + iVar12];
  }
  fVar15 = 0.0;
  fVar16 = 0.0;
  if (0 < iVar6 && 0 < iVar5) {
    fVar16 = pfVar3[(iVar6 + -1) * iVar2 + iVar11];
  }
  if (0 < iVar7 && 0 < iVar6) {
    fVar15 = pfVar3[(iVar6 + -1) * iVar2 + iVar12];
  }
  fVar18 = 0.0;
  fVar17 = 0.0;
  iVar8 = row - iVar9;
  if (iVar1 < row - iVar9) {
    iVar8 = iVar1;
  }
  if (0 < iVar8 && 0 < iVar5) {
    fVar17 = pfVar3[(iVar8 + -1) * iVar2 + iVar11];
  }
  if (0 < iVar7 && 0 < iVar8) {
    fVar18 = pfVar3[(iVar8 + -1) * iVar2 + iVar12];
  }
  fVar20 = 0.0;
  fVar19 = 0.0;
  if (0 < iVar5 && 0 < iVar4) {
    fVar19 = pfVar3[iVar10 * iVar2 + iVar11];
  }
  if (0 < iVar7 && 0 < iVar4) {
    fVar20 = pfVar3[iVar10 * iVar2 + iVar12];
  }
  return ((fVar14 - fVar16) + (fVar15 - fVar13)) - ((fVar17 - fVar19) + (fVar20 - fVar18));
}

Assistant:

inline float haarY_improved(struct integral_image *iimage, int row, int col, int s) {
    return box_integral_improved(iimage, row, col-s/2, s/2, s) - box_integral_improved(iimage, row-s/2, col-s/2, s/2, s);
}